

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O3

int __thiscall
cpprofiler::Connector::connect(Connector *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint __val;
  bool bVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  undefined8 extraout_RAX;
  uint uVar6;
  addrinfo *paVar7;
  addrinfo *servinfo;
  string __str;
  addrinfo *local_80;
  char *local_78;
  uint local_70;
  char local_68 [16];
  addrinfo local_58;
  
  local_58.ai_flags = 0;
  local_58.ai_family = 0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_socktype = 1;
  local_58.ai_protocol = 0;
  __val = this->port;
  cVar3 = '\x01';
  if (9 < __val) {
    uVar6 = __val;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar6 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_001ba95f;
      }
      if (uVar6 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_001ba95f;
      }
      if (uVar6 < 10000) goto LAB_001ba95f;
      bVar1 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_001ba95f:
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_78,local_70,__val);
  iVar4 = getaddrinfo("localhost",local_78,&local_58,&local_80);
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  paVar7 = local_80;
  if (iVar4 == 0) {
    for (; paVar7 != (addrinfo *)0x0; paVar7 = paVar7->ai_next) {
      iVar4 = socket(paVar7->ai_family,paVar7->ai_socktype,paVar7->ai_protocol);
      this->sockfd = iVar4;
      if (iVar4 != -1) {
        iVar4 = ::connect(iVar4,paVar7->ai_addr,paVar7->ai_addrlen);
        if (iVar4 != -1) {
          freeaddrinfo(local_80);
          iVar4 = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          goto LAB_001baa78;
        }
        close(this->sockfd);
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"getaddrinfo: ",0xd);
    __s = gai_strerror(iVar4);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2124d0);
    }
    else {
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  }
  iVar4 = 0;
LAB_001baa78:
  this->_connected = SUB41(iVar4,0);
  return iVar4;
}

Assistant:

void connect() {
    struct addrinfo hints, *servinfo, *p;
    int rv;

#ifdef WIN32
    // Initialise Winsock.
    WSADATA wsaData;
    int startupResult = WSAStartup(MAKEWORD(2, 2), &wsaData);
    if (startupResult != 0) {
      printf("WSAStartup failed with error: %d\n", startupResult);
    }
#endif

    memset(&hints, 0, sizeof hints);
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;

    if ((rv = getaddrinfo("localhost", std::to_string(port).c_str(), &hints,
                          &servinfo)) != 0) {
      std::cerr << "getaddrinfo: " << gai_strerror(rv) << "\n";
      goto giveup;
    }

    // loop through all the results and connect to the first we can
    for (p = servinfo; p != NULL; p = p->ai_next) {
      if ((sockfd = socket(p->ai_family, p->ai_socktype, p->ai_protocol)) == -1) {
        // errno is set here, but we don't examine it.
        continue;
      }

      if (::connect(sockfd, p->ai_addr, p->ai_addrlen) == -1) {
#ifdef WIN32
        closesocket(sockfd);
#else
        close(sockfd);
#endif
        // errno is set here, but we don't examine it.
        continue;
      }

      break;
    }

    // Connection failed; give up.
    if (p == NULL) {
      goto giveup;
    }

    freeaddrinfo(servinfo);  // all done with this structure

    _connected = true;

    return;
giveup:
    _connected = false;
    return;

  }